

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void __thiscall
xLearn::PARSER_TEST_Parse_libsvm_Test::~PARSER_TEST_Parse_libsvm_Test
          (PARSER_TEST_Parse_libsvm_Test *this)

{
  void *in_RDI;
  
  ~PARSER_TEST_Parse_libsvm_Test((PARSER_TEST_Parse_libsvm_Test *)0x14dad8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libsvm) {
  write_data(Kfilename, kStr);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  LibsvmParser parser;
  parser.setLabel(true);
  parser.setSplitor(" ");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, false);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, true, false);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, true, false);
  RemoveFile(Kfilename.c_str());
}